

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O3

Vec_Int_t * Vec_WecPushLevel(Vec_Wec_t *p)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  uVar4 = p->nSize;
  if (uVar4 == p->nCap) {
    if ((int)uVar4 < 0x10) {
      if (p->pArray == (Vec_Int_t *)0x0) {
        pVVar1 = (Vec_Int_t *)malloc(0x100);
      }
      else {
        pVVar1 = (Vec_Int_t *)realloc(p->pArray,0x100);
        uVar4 = p->nCap;
      }
      p->pArray = pVVar1;
      iVar2 = 0x10 - uVar4;
      pVVar1 = pVVar1 + (int)uVar4;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar4 * 2;
      if (p->pArray == (Vec_Int_t *)0x0) {
        pVVar1 = (Vec_Int_t *)malloc((ulong)uVar4 << 5);
      }
      else {
        pVVar1 = (Vec_Int_t *)realloc(p->pArray,(ulong)uVar4 << 5);
        uVar4 = p->nCap;
      }
      p->pArray = pVVar1;
      iVar2 = iVar3 - uVar4;
      pVVar1 = pVVar1 + (int)uVar4;
    }
    memset(pVVar1,0,(long)iVar2 << 4);
    p->nCap = iVar3;
    uVar4 = p->nSize;
  }
  p->nSize = uVar4 + 1;
  if (-1 < (int)uVar4) {
    return p->pArray + ((ulong)(uVar4 + 1) - 1);
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
}

Assistant:

static inline Vec_Int_t * Vec_WecPushLevel( Vec_Wec_t * p )
{
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_WecGrow( p, 16 );
        else
            Vec_WecGrow( p, 2 * p->nCap );
    }
    ++p->nSize;
    return Vec_WecEntryLast( p );
}